

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QList<QCss::StyleRule> * __thiscall
QStyleSheetStyle::styleRules(QStyleSheetStyle *this,QObject *obj)

{
  bool bVar1;
  byte bVar2;
  QString *pQVar3;
  ulong uVar4;
  QDebug *o_00;
  long lVar5;
  qsizetype qVar6;
  reference pSVar7;
  QObject *in_RDX;
  long in_RSI;
  NodePtr in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  int i;
  QObject *o;
  QStyle *bs;
  QList<QCss::StyleRule> *rules;
  NodePtr n;
  const_iterator objCacheIt;
  StyleSheet ss_1;
  QString styleSheet;
  QList<QCss::StyleSheet> objectSs;
  QString ss;
  const_iterator appCacheIt;
  StyleSheet appSs;
  const_iterator defaultCacheIt;
  StyleSheet defaultSs;
  QStyleSheetStyleSelector styleSelector;
  const_iterator cacheIt;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  QStyleSheetStyle *in_stack_fffffffffffffa08;
  QObject *in_stack_fffffffffffffa10;
  QHash<const_void_*,_QCss::StyleSheet> *in_stack_fffffffffffffa18;
  QObject *in_stack_fffffffffffffa20;
  QStyleSheetStyle *in_stack_fffffffffffffa28;
  offset_in_QStyleSheetStyleCaches_to_subr *slot;
  ContextType *context;
  NodePtr sender;
  offset_in_QObject_to_subr local_598;
  int local_584;
  ConnectionType in_stack_fffffffffffffa90;
  QObject *local_568;
  QDebug local_4d0;
  QDebug local_4c8;
  QDebug local_4c0;
  undefined2 local_4b2;
  QLatin1StringView local_4b0;
  undefined1 local_488 [24];
  piter local_470;
  QObject *local_460;
  piter local_458;
  undefined1 local_448 [120];
  undefined4 local_3d0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  QList<QCss::StyleSheet> local_390;
  QCoreApplication *local_378;
  char local_370 [56];
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  piter local_320;
  QCoreApplication *local_310;
  piter local_308;
  undefined1 local_2f8 [120];
  undefined4 local_280;
  undefined4 local_27c;
  QStyleSheetStyle *in_stack_fffffffffffffd88;
  Connection local_230;
  QStyle *local_228;
  piter local_180;
  QStyle *local_170;
  piter local_168;
  offset_in_QStyleSheetStyleCaches_to_subr local_158 [20];
  undefined1 local_b8 [72];
  piter local_70;
  piter local_60;
  QObject *local_50;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d = (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  sender = in_RDI;
  local_50 = in_RDX;
  local_60 = (piter)QHash<const_QObject_*,_QList<QCss::StyleRule>_>::constFind
                              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                               (QObject **)
                               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  local_70 = (piter)QHash<const_QObject_*,_QList<QCss::StyleRule>_>::constEnd
                              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)
                               in_stack_fffffffffffffa08);
  bVar1 = QHash<const_QObject_*,_QList<QCss::StyleRule>_>::const_iterator::operator!=
                    ((const_iterator *)in_stack_fffffffffffffa08,
                     (const_iterator *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                    );
  if (bVar1) {
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::const_iterator::value
              ((const_iterator *)0x426a7c);
    QList<QCss::StyleRule>::QList
              ((QList<QCss::StyleRule> *)
               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
               (QList<QCss::StyleRule> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  else {
    bVar1 = initObject(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    if (bVar1) {
      memset(local_b8,0xaa,0x48);
      QStyleSheetStyleSelector::QStyleSheetStyleSelector
                ((QStyleSheetStyleSelector *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      memset(local_158,0xaa,0xa0);
      QCss::StyleSheet::StyleSheet
                ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      local_168.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)
                    &DAT_aaaaaaaaaaaaaaaa;
      context = (ContextType *)&styleSheetCaches->styleSheetCache;
      local_170 = baseStyle(in_stack_fffffffffffffa08);
      local_168 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constFind
                                   ((QHash<const_void_*,_QCss::StyleSheet> *)
                                    CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                    (void **)CONCAT44(in_stack_fffffffffffff9fc,
                                                      in_stack_fffffffffffff9f8));
      local_180 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constEnd
                                   ((QHash<const_void_*,_QCss::StyleSheet> *)
                                    in_stack_fffffffffffffa08);
      bVar1 = QHash<const_void_*,_QCss::StyleSheet>::const_iterator::operator==
                        ((const_iterator *)in_stack_fffffffffffffa08,
                         (const_iterator *)
                         CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      if (bVar1) {
        getDefaultStyleSheet(in_stack_fffffffffffffd88);
        slot = local_158;
        QCss::StyleSheet::operator=
                  ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (StyleSheet *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        QCss::StyleSheet::~StyleSheet
                  ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        local_228 = baseStyle(in_stack_fffffffffffffa08);
        QHash<const_void_*,_QCss::StyleSheet>::insert
                  ((QHash<const_void_*,_QCss::StyleSheet> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (void **)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (StyleSheet *)0x426c23);
        in_stack_fffffffffffff9f8 = 0;
        QObject::connect<void(QObject::*)(QObject*),void(QStyleSheetStyleCaches::*)(QObject*)>
                  ((Object *)sender.ptr,local_598,context,slot,in_stack_fffffffffffffa90);
        QMetaObject::Connection::~Connection(&local_230);
      }
      else {
        QHash<const_void_*,_QCss::StyleSheet>::const_iterator::value((const_iterator *)0x426cc2);
        QCss::StyleSheet::operator=
                  ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (StyleSheet *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
      QList<QCss::StyleSheet>::operator+=
                ((QList<QCss::StyleSheet> *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (parameter_type)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      QCoreApplication::instance();
      QApplication::styleSheet
                ((QApplication *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      bVar1 = QString::isEmpty((QString *)0x426d0d);
      QString::~QString((QString *)0x426d20);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        memset(local_2f8,0xaa,0xa0);
        QCss::StyleSheet::StyleSheet
                  ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        local_308.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_308.d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)
                      &DAT_aaaaaaaaaaaaaaaa;
        local_310 = QCoreApplication::instance();
        local_308 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constFind
                                     ((QHash<const_void_*,_QCss::StyleSheet> *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (void **)CONCAT44(in_stack_fffffffffffff9fc,
                                                        in_stack_fffffffffffff9f8));
        local_320 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constEnd
                                     ((QHash<const_void_*,_QCss::StyleSheet> *)
                                      in_stack_fffffffffffffa08);
        bVar1 = QHash<const_void_*,_QCss::StyleSheet>::const_iterator::operator==
                          ((const_iterator *)in_stack_fffffffffffffa08,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        if (bVar1) {
          local_338 = &DAT_aaaaaaaaaaaaaaaa;
          local_330 = &DAT_aaaaaaaaaaaaaaaa;
          local_328 = &DAT_aaaaaaaaaaaaaaaa;
          QCoreApplication::instance();
          QApplication::styleSheet
                    ((QApplication *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          QVar8 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffa08,
                             CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          uVar4 = QString::startsWith((QLatin1String *)&local_338,(CaseSensitivity)QVar8.m_size);
          if ((uVar4 & 1) != 0) {
            QString::remove((longlong)&local_338,0);
          }
          pQVar3 = (QString *)(in_RSI + 0x20);
          QCoreApplication::instance();
          QApplication::styleSheet
                    ((QApplication *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          ::operator!=((QString *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       (QString *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          QCss::Parser::init(pQVar3,SUB81(&local_338,0));
          QString::~QString((QString *)0x426eea);
          bVar2 = QCss::Parser::parse((StyleSheet *)(in_RSI + 0x20),(CaseSensitivity)local_2f8);
          if (((bVar2 ^ 0xff) & 1) != 0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08
                       ,in_stack_fffffffffffffa04,
                       (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            QMessageLogger::warning(local_370,"Could not parse application stylesheet");
          }
          local_280 = 4;
          local_27c = 1;
          in_stack_fffffffffffffa18 = &styleSheetCaches->styleSheetCache;
          local_378 = QCoreApplication::instance();
          QHash<const_void_*,_QCss::StyleSheet>::insert
                    ((QHash<const_void_*,_QCss::StyleSheet> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                     (void **)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     (StyleSheet *)0x426f8a);
          QString::~QString((QString *)0x426fa7);
        }
        else {
          QHash<const_void_*,_QCss::StyleSheet>::const_iterator::value((const_iterator *)0x426fb6);
          QCss::StyleSheet::operator=
                    ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                     (StyleSheet *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        }
        QList<QCss::StyleSheet>::operator+=
                  ((QList<QCss::StyleSheet> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (parameter_type)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        QCss::StyleSheet::~StyleSheet
                  ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      }
      local_390.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_390.d.ptr = (StyleSheet *)&DAT_aaaaaaaaaaaaaaaa;
      local_390.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QCss::StyleSheet>::QList((QList<QCss::StyleSheet> *)0x427026);
      local_568 = local_50;
      while (local_568 != (QObject *)0x0) {
        local_3a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_3a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_398 = &DAT_aaaaaaaaaaaaaaaa;
        QObject::property((char *)&local_28);
        ::QVariant::toString();
        ::QVariant::~QVariant(&local_28);
        bVar1 = QString::isEmpty((QString *)0x4270bd);
        if (!bVar1) {
          memset(local_448,0xaa,0xa0);
          QCss::StyleSheet::StyleSheet
                    ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          local_458.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_458.d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)
                        &DAT_aaaaaaaaaaaaaaaa;
          local_460 = local_568;
          local_458 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constFind
                                       ((QHash<const_void_*,_QCss::StyleSheet> *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (void **)CONCAT44(in_stack_fffffffffffff9fc,
                                                          in_stack_fffffffffffff9f8));
          local_470 = (piter)QHash<const_void_*,_QCss::StyleSheet>::constEnd
                                       ((QHash<const_void_*,_QCss::StyleSheet> *)
                                        in_stack_fffffffffffffa08);
          bVar1 = QHash<const_void_*,_QCss::StyleSheet>::const_iterator::operator==
                            ((const_iterator *)in_stack_fffffffffffffa08,
                             (const_iterator *)
                             CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          if (bVar1) {
            QCss::Parser::init((QString *)(in_RSI + 0x20),SUB81(&local_3a8,0));
            uVar4 = QCss::Parser::parse((StyleSheet *)(in_RSI + 0x20),(CaseSensitivity)local_448);
            if ((uVar4 & 1) == 0) {
              in_stack_fffffffffffffa10 = (QObject *)(in_RSI + 0x20);
              local_4b0 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffffa08,
                                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
              ::operator+((QLatin1String *)
                          CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (QString *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              local_4b2 = 0x7d;
              ::operator+((QStringBuilder<QLatin1String,_QString_&> *)
                          CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (char16_t *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t> *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              QCss::Parser::init((QString *)in_stack_fffffffffffffa10,SUB81(local_488,0));
              QString::~QString((QString *)0x42726f);
              bVar2 = QCss::Parser::parse((StyleSheet *)(in_RSI + 0x20),(CaseSensitivity)local_448);
              if (((bVar2 ^ 0xff) & 1) != 0) {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffffa10,
                           (char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,
                           (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                QMessageLogger::warning();
                o_00 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffa18,(char *)context);
                QDebug::QDebug(&local_4c8,o_00);
                ::operator<<((QDebug *)&local_4c0,(QObject *)&local_4c8);
                QDebug::~QDebug(&local_4c0);
                QDebug::~QDebug(&local_4c8);
                QDebug::~QDebug(&local_4d0);
              }
            }
            local_3d0 = 4;
            QHash<const_void_*,_QCss::StyleSheet>::insert
                      ((QHash<const_void_*,_QCss::StyleSheet> *)
                       CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       (void **)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       (StyleSheet *)0x427369);
          }
          else {
            QHash<const_void_*,_QCss::StyleSheet>::const_iterator::value((const_iterator *)0x427388)
            ;
            QCss::StyleSheet::operator=
                      ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       (StyleSheet *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          }
          QList<QCss::StyleSheet>::append
                    ((QList<QCss::StyleSheet> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                     (parameter_type)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          QCss::StyleSheet::~StyleSheet
                    ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        }
        QString::~QString((QString *)0x4273d2);
        local_568 = parentObject(in_stack_fffffffffffffa10);
      }
      local_584 = 0;
      while( true ) {
        lVar5 = (long)local_584;
        qVar6 = QList<QCss::StyleSheet>::size(&local_390);
        if (qVar6 <= lVar5) break;
        qVar6 = QList<QCss::StyleSheet>::size(&local_390);
        in_stack_fffffffffffffa04 = ((int)qVar6 - local_584) + 2;
        pSVar7 = QList<QCss::StyleSheet>::operator[]
                           ((QList<QCss::StyleSheet> *)
                            CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                            CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        pSVar7->depth = in_stack_fffffffffffffa04;
        local_584 = local_584 + 1;
      }
      QList<QCss::StyleSheet>::operator+=
                ((QList<QCss::StyleSheet> *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (QList<QCss::StyleSheet> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      *(undefined1 **)sender.ptr = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)((long)sender.ptr + 8) = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)((long)sender.ptr + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
      QCss::StyleSelector::styleRulesForNode(sender);
      QHash<const_QObject_*,_QList<QCss::StyleRule>_>::insert
                ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (QObject **)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (QList<QCss::StyleRule> *)0x427525);
      QList<QCss::StyleSheet>::~QList((QList<QCss::StyleSheet> *)0x427563);
      QCss::StyleSheet::~StyleSheet
                ((StyleSheet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      QStyleSheetStyleSelector::~QStyleSheetStyleSelector
                ((QStyleSheetStyleSelector *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    }
    else {
      memset(sender.ptr,0,0x18);
      QList<QCss::StyleRule>::QList((QList<QCss::StyleRule> *)0x426abf);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QCss::StyleRule> *)in_RDI.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QList<QCss::StyleRule> QStyleSheetStyle::styleRules(const QObject *obj) const
{
    QHash<const QObject *, QList<StyleRule>>::const_iterator cacheIt =
            styleSheetCaches->styleRulesCache.constFind(obj);
    if (cacheIt != styleSheetCaches->styleRulesCache.constEnd())
        return cacheIt.value();

    if (!initObject(obj)) {
        return QList<StyleRule>();
    }

    QStyleSheetStyleSelector styleSelector;

    StyleSheet defaultSs;
    QHash<const void *, StyleSheet>::const_iterator defaultCacheIt = styleSheetCaches->styleSheetCache.constFind(baseStyle());
    if (defaultCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
        defaultSs = getDefaultStyleSheet();
        QStyle *bs = baseStyle();
        styleSheetCaches->styleSheetCache.insert(bs, defaultSs);
        QObject::connect(bs, &QStyle::destroyed, styleSheetCaches,
                         &QStyleSheetStyleCaches::styleDestroyed);
    } else {
        defaultSs = defaultCacheIt.value();
    }
    styleSelector.styleSheets += defaultSs;

    if (!qApp->styleSheet().isEmpty()) {
        StyleSheet appSs;
        QHash<const void *, StyleSheet>::const_iterator appCacheIt = styleSheetCaches->styleSheetCache.constFind(qApp);
        if (appCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            QString ss = qApp->styleSheet();
            if (ss.startsWith("file:///"_L1))
                ss.remove(0, 8);
            parser.init(ss, qApp->styleSheet() != ss);
            if (Q_UNLIKELY(!parser.parse(&appSs)))
                qWarning("Could not parse application stylesheet");
            appSs.origin = StyleSheetOrigin_Inline;
            appSs.depth = 1;
            styleSheetCaches->styleSheetCache.insert(qApp, appSs);
        } else {
            appSs = appCacheIt.value();
        }
        styleSelector.styleSheets += appSs;
    }

    QList<QCss::StyleSheet> objectSs;
    for (const QObject *o = obj; o; o = parentObject(o)) {
        QString styleSheet = o->property("styleSheet").toString();
        if (styleSheet.isEmpty())
            continue;
        StyleSheet ss;
        QHash<const void *, StyleSheet>::const_iterator objCacheIt = styleSheetCaches->styleSheetCache.constFind(o);
        if (objCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            parser.init(styleSheet);
            if (!parser.parse(&ss)) {
                parser.init("* {"_L1 + styleSheet + u'}');
                if (Q_UNLIKELY(!parser.parse(&ss)))
                   qWarning() << "Could not parse stylesheet of object" << o;
            }
            ss.origin = StyleSheetOrigin_Inline;
            styleSheetCaches->styleSheetCache.insert(o, ss);
        } else {
            ss = objCacheIt.value();
        }
        objectSs.append(ss);
    }

    for (int i = 0; i < objectSs.size(); i++)
        objectSs[i].depth = objectSs.size() - i + 2;

    styleSelector.styleSheets += objectSs;

    StyleSelector::NodePtr n;
    n.ptr = const_cast<QObject *>(obj);
    QList<QCss::StyleRule> rules = styleSelector.styleRulesForNode(n);
    styleSheetCaches->styleRulesCache.insert(obj, rules);
    return rules;
}